

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ISXD.cpp
# Opt level: O2

h__Reader * __thiscall AS_02::ISXD::MXFReader::h__Reader::OpenRead(h__Reader *this,string *filename)

{
  list *plVar1;
  ILogSink *pIVar2;
  InterchangeObject *tmp_iobj;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> ObjectList
  ;
  Result_t result;
  Result_t local_150 [104];
  Result_t local_e8 [104];
  Result_t local_80 [104];
  
  h__AS02Reader::OpenMXFRead((h__AS02Reader *)&result,filename);
  if (-1 < _result) {
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    plVar1 = (list *)((filename->field_2)._M_local_buf + 8);
    ASDCP::MXF::OP1aHeader::GetMDObjectByType((uchar *)local_80,(InterchangeObject **)plVar1);
    Kumu::Result_t::~Result_t(local_80);
    pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar2,"ISXDDataEssenceDescriptor not found.\n");
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    ASDCP::MXF::OP1aHeader::GetMDObjectByType((uchar *)local_e8,(InterchangeObject **)plVar1);
    Kumu::Result_t::~Result_t(local_e8);
    ObjectList.
    super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ObjectList;
    ObjectList.
    super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
    ._M_impl._M_node._M_size = 0;
    ObjectList.
    super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         ObjectList.
         super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    ASDCP::MXF::OP1aHeader::GetMDObjectsByType((uchar *)local_150,plVar1);
    Kumu::Result_t::~Result_t(local_150);
    if (ObjectList.
        super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
        ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&ObjectList) {
      pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar2,"MXF Metadata contains no Track Sets.\n");
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)RESULT_AS02_FORMAT);
      std::__cxx11::
      _List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
      ::_M_clear(&ObjectList.
                  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                );
      goto LAB_0013dc15;
    }
    std::__cxx11::
    _List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
    _M_clear(&ObjectList.
              super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
            );
  }
  Kumu::Result_t::Result_t((Result_t *)this,&result);
LAB_0013dc15:
  Kumu::Result_t::~Result_t(&result);
  return this;
}

Assistant:

Result_t
AS_02::ISXD::MXFReader::h__Reader::OpenRead(const std::string& filename)
{
  Result_t result = OpenMXFRead(filename);

  if( KM_SUCCESS(result) )
    {
      InterchangeObject* tmp_iobj = 0;

      m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(ISXDDataEssenceDescriptor), &tmp_iobj);

      if ( tmp_iobj == 0 )
	{
	  DefaultLogSink().Error("ISXDDataEssenceDescriptor not found.\n");
	}

      m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(ISXDDataEssenceDescriptor), &tmp_iobj);

      std::list<InterchangeObject*> ObjectList;
      m_HeaderPart.GetMDObjectsByType(OBJ_TYPE_ARGS(Track), ObjectList);

      if ( ObjectList.empty() )
	{
	  DefaultLogSink().Error("MXF Metadata contains no Track Sets.\n");
	  return RESULT_AS02_FORMAT;
	}
    }


  return result;
}